

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathtypes.h
# Opt level: O0

rect2d __thiscall rengine::rect2d::normalized(rect2d *this)

{
  vec2 tl;
  vec2 br;
  rect2d *this_local;
  
  tl = min(this->tl,this->br);
  br = max(this->tl,this->br);
  rect2d((rect2d *)&this_local,tl,br);
  return _this_local;
}

Assistant:

rect2d normalized() const { return rect2d(min(tl, br), max(tl, br)); }